

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O1

int Hop_ObjFanoutCount_rec(Hop_Obj_t *pObj,Hop_Obj_t *pPivot)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopDfs.c"
                  ,0x12d,"int Hop_ObjFanoutCount_rec(Hop_Obj_t *, Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 4) {
    iVar1 = Hop_ObjFanoutCount_rec((Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pPivot);
    iVar2 = Hop_ObjFanoutCount_rec((Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),pPivot);
    if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopDfs.c"
                    ,0x132,"int Hop_ObjFanoutCount_rec(Hop_Obj_t *, Hop_Obj_t *)");
    }
    uVar3 = iVar2 + iVar1;
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
  }
  else {
    uVar3 = (uint)(pObj == pPivot);
  }
  return uVar3;
}

Assistant:

int Hop_ObjFanoutCount_rec( Hop_Obj_t * pObj, Hop_Obj_t * pPivot )
{
    int Counter;
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return (int)(pObj == pPivot);
    Counter = Hop_ObjFanoutCount_rec( Hop_ObjFanin0(pObj), pPivot ) + 
              Hop_ObjFanoutCount_rec( Hop_ObjFanin1(pObj), pPivot );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
    return Counter;
}